

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

gs_stmt_t * gs_parse_stmt_block(gs_parser_t *parser)

{
  char *__src;
  _Bool _Var1;
  int iVar2;
  gs_stmt_t *pgVar3;
  gs_expr_t **__dest;
  long lVar4;
  char *local_48;
  int aiStack_40 [2];
  char *local_38;
  
  local_48 = (char *)0x0;
  aiStack_40[0] = 0;
  aiStack_40[1] = 0;
  local_38 = "script/parser";
  do {
    _Var1 = gs_eat_char(parser,'}');
    iVar2 = aiStack_40[0];
    __src = local_48;
    if (_Var1) {
      lVar4 = (long)aiStack_40[0];
      pgVar3 = (gs_stmt_t *)gs_parser_alloc(parser,0x48);
      pgVar3->type = GS_STMT_BLOCK;
      (pgVar3->field_1).if_stmt.num_conds = iVar2;
      __dest = (gs_expr_t **)gs_parser_alloc(parser,lVar4 << 3);
      (pgVar3->field_1).if_stmt.conds = __dest;
      memcpy(__dest,__src,lVar4 << 3);
LAB_00136bd0:
      golf_free_tracked(local_48);
      return pgVar3;
    }
    pgVar3 = gs_parse_stmt(parser);
    if (parser->error != false) {
      pgVar3 = (gs_stmt_t *)0x0;
      goto LAB_00136bd0;
    }
    iVar2 = vec_expand_(&local_48,aiStack_40,aiStack_40 + 1,8,local_38);
    if (iVar2 == 0) {
      lVar4 = (long)aiStack_40[0];
      aiStack_40[0] = aiStack_40[0] + 1;
      *(gs_stmt_t **)(local_48 + lVar4 * 8) = pgVar3;
    }
  } while( true );
}

Assistant:

static gs_stmt_t *gs_parse_stmt_block(gs_parser_t *parser) {
    vec_gs_stmt_t stmts;
    vec_init(&stmts, "script/parser");

    gs_token_t token = gs_peek(parser);
    gs_stmt_t *stmt = NULL;

    while (!gs_eat_char(parser, '}')) {
        gs_stmt_t *stmt = gs_parse_stmt(parser);
        if (parser->error) goto cleanup;

        vec_push(&stmts, stmt);
    }

    stmt = gs_stmt_block_new(parser, token, stmts);

cleanup:
    vec_deinit(&stmts);
    return stmt;
}